

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O1

void __thiscall TPZEqnArray<float>::EndEquation(TPZEqnArray<float> *this)

{
  int iVar1;
  
  iVar1 = this->fLastTerm;
  (*(this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>._vptr_TPZVec[3])
            (&this->fEqStart,
             (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fNElements + 1);
  (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore
  [(this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fNElements + -1] = iVar1;
  return;
}

Assistant:

void TPZEqnArray<TVar>::EndEquation() {
	fEqStart.Push(fLastTerm);
}